

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error pred<0,false>(context *ctx,token *token,opcode *op)

{
  ulong *in_RCX;
  error *tmpres___LINE__;
  token local_48;
  
  confirm_type((token *)ctx,(token_type)op);
  if (ctx->pc == 0) {
    if ((*in_RCX & (long)(int)op->reuse) != 0) {
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    *in_RCX = *in_RCX | (long)(int)op->reuse;
    if ((op->sched).raw == 0) {
      context::tokenize(&local_48,(context *)token);
      *(int *)&op[2].value = local_48.column;
      op[1].value = (uint64_t)local_48.data.string._M_str;
      op[1].reuse = local_48.type;
      op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.line;
      op->value = (uint64_t)local_48.filename;
      op->reuse = local_48.data.predicate.index;
      op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.data.predicate.negated;
      ctx->pc = 0;
    }
    else {
      fail((token *)ctx,(char *)op,"predicate can\'t be negated");
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(pred)
{
    CHECK(confirm_type(token, token_type::predicate));
    op.add_bits(static_cast<uint64_t>(token.data.predicate.index) << address);
    if constexpr (negable) {
        op.add_bits(static_cast<uint64_t>(token.data.predicate.negated) << (address + 3));
    } else {
        if (token.data.predicate.negated) {
            return fail(token, "predicate can't be negated");
        }
    }
    token = ctx.tokenize();
    return {};
}